

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__filename;
  size_type sVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  int *piVar8;
  void *in_R8;
  char *binpath;
  bool bVar9;
  value_type *__val;
  float scale;
  vector<float,_std::allocator<float>_> scales;
  string key_str;
  NetQuantize quantizer;
  char key [256];
  float local_31c;
  float *local_318;
  iterator iStack_310;
  float *local_308;
  char *local_2f8;
  FILE *local_2f0;
  Mat local_2e8;
  float *local_298;
  int *local_290;
  undefined8 local_288;
  undefined4 local_280;
  long *local_278;
  undefined4 local_270;
  int local_26c;
  undefined8 local_268;
  undefined4 local_260;
  long local_258;
  key_type local_250;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  NetQuantize local_210;
  DataReader local_138 [33];
  
  if (argc != 6) {
    main_cold_1();
    return -1;
  }
  local_218 = argv[1];
  pcVar4 = argv[2];
  pcVar5 = argv[3];
  binpath = argv[4];
  __filename = argv[5];
  ModelWriter::ModelWriter(&local_210.super_ModelWriter);
  local_210.super_ModelWriter.super_Net._vptr_Net = (_func_int **)&PTR__NetQuantize_00350bc0;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__filename != (char *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
    ::clear(&local_210.blob_int8scale_table._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
    ::clear(&local_210.weight_int8scale_table._M_t);
    pFVar3 = fopen(__filename,"rb");
    if (pFVar3 == (FILE *)0x0) {
      main_cold_2();
      iVar2 = -1;
      goto LAB_00146b17;
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    local_250._M_string_length = 0;
    local_250.field_2._M_local_buf[0] = '\0';
    local_308 = (float *)0x0;
    local_318 = (float *)0x0;
    iStack_310._M_current = (float *)0x0;
    local_2f0 = pFVar3;
    local_230 = pcVar4;
    local_228 = binpath;
    local_220 = pcVar5;
    pcVar4 = (char *)operator_new(0x9c4000);
    memset(pcVar4,0,0x9c4000);
    pFVar3 = local_2f0;
    iVar2 = feof(local_2f0);
    if (iVar2 == 0) {
      local_2f8 = pcVar4;
      do {
        pcVar5 = fgets(pcVar4,0x9c4000,pFVar3);
        if (pcVar5 == (char *)0x0) break;
        local_31c = 1.0;
        sVar6 = strcspn(pcVar4,"\r\n");
        pcVar4[sVar6] = '\0';
        pcVar5 = strtok(pcVar4," ");
        pFVar3 = local_2f0;
        if (pcVar5 == (char *)0x0) break;
        bVar9 = true;
        do {
          if (bVar9) {
            __isoc99_sscanf(pcVar5,"%255s",local_138);
            sVar1 = local_250._M_string_length;
            in_R8 = (void *)strlen((char *)local_138);
            std::__cxx11::string::_M_replace((ulong)&local_250,0,(char *)sVar1,(ulong)local_138);
          }
          else {
            __isoc99_sscanf(pcVar5,"%f",&local_31c);
            if (iStack_310._M_current == local_308) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_318,iStack_310,&local_31c);
            }
            else {
              *iStack_310._M_current = local_31c;
              iStack_310._M_current = iStack_310._M_current + 1;
            }
          }
          bVar9 = false;
          pcVar5 = strtok((char *)0x0," ");
        } while (pcVar5 != (char *)0x0);
        pcVar4 = strstr(local_250._M_dataplus._M_p,"_param_");
        if (pcVar4 == (char *)0x0) {
          local_298 = local_318;
          local_290 = (int *)0x0;
          local_288 = 4;
          local_280 = 1;
          local_278 = (long *)0x0;
          local_270 = 1;
          local_26c = (int)((ulong)((long)iStack_310._M_current - (long)local_318) >> 2);
          local_268 = 0x100000001;
          local_260 = 1;
          local_258 = (long)local_26c;
          ncnn::Mat::clone(&local_2e8,(__fn *)&local_298,(void *)0x0,local_26c,in_R8);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::operator[](&local_210.blob_int8scale_table,&local_250);
          piVar8 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
          if (pmVar7 != &local_2e8) {
            if (piVar8 != (int *)0x0) {
              LOCK();
              *piVar8 = *piVar8 + 1;
              UNLOCK();
            }
            piVar8 = pmVar7->refcount;
            if (piVar8 != (int *)0x0) {
              LOCK();
              *piVar8 = *piVar8 + -1;
              UNLOCK();
              if (*piVar8 == 0) {
                if (pmVar7->allocator == (Allocator *)0x0) {
                  if (pmVar7->data != (void *)0x0) {
                    free(pmVar7->data);
                  }
                }
                else {
                  (*pmVar7->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pmVar7->cstep = 0;
            pmVar7->data = (void *)0x0;
            pmVar7->refcount = (int *)0x0;
            *(undefined8 *)((long)&pmVar7->refcount + 4) = 0;
            *(undefined8 *)((long)&pmVar7->elemsize + 4) = 0;
            pmVar7->dims = 0;
            pmVar7->w = 0;
            pmVar7->h = 0;
            pmVar7->d = 0;
            pmVar7->c = 0;
            pmVar7->data = local_2e8.data;
            piVar8 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
            pmVar7->refcount = piVar8;
            pmVar7->elemsize = CONCAT44(local_2e8.elemsize._4_4_,(undefined4)local_2e8.elemsize);
            pmVar7->elempack = local_2e8.elempack;
            pmVar7->allocator = local_2e8.allocator;
            pmVar7->dims = local_2e8.dims;
            pmVar7->w = local_2e8.w;
            pmVar7->h = local_2e8.h;
            pmVar7->d = local_2e8.d;
            pmVar7->c = local_2e8.c;
            pmVar7->cstep = local_2e8.cstep;
          }
          pcVar4 = local_2f8;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (local_2e8.allocator == (Allocator *)0x0) {
                if (local_2e8.data != (void *)0x0) {
                  free(local_2e8.data);
                }
              }
              else {
                (*(local_2e8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2e8.cstep = 0;
          local_2e8.data = (void *)0x0;
          local_2e8.refcount._0_4_ = 0;
          local_2e8.refcount._4_4_ = 0;
          local_2e8.elemsize._0_4_ = 0;
          local_2e8.elemsize._4_4_ = 0;
          local_2e8.elempack = 0;
          local_2e8.dims = 0;
          local_2e8.w = 0;
          local_2e8.h = 0;
          local_2e8.d = 0;
          local_2e8.c = 0;
          if (local_290 != (int *)0x0) {
            LOCK();
            *local_290 = *local_290 + -1;
            UNLOCK();
            if (*local_290 == 0) {
              if (local_278 == (long *)0x0) goto LAB_00147057;
              (**(code **)(*local_278 + 0x18))();
            }
          }
        }
        else {
          local_298 = local_318;
          local_290 = (int *)0x0;
          local_288 = 4;
          local_280 = 1;
          local_278 = (long *)0x0;
          local_270 = 1;
          local_26c = (int)((ulong)((long)iStack_310._M_current - (long)local_318) >> 2);
          local_268 = 0x100000001;
          local_260 = 1;
          local_258 = (long)local_26c;
          ncnn::Mat::clone(&local_2e8,(__fn *)&local_298,(void *)0x0,local_26c,in_R8);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::operator[](&local_210.weight_int8scale_table,&local_250);
          piVar8 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
          if (pmVar7 != &local_2e8) {
            if (piVar8 != (int *)0x0) {
              LOCK();
              *piVar8 = *piVar8 + 1;
              UNLOCK();
            }
            piVar8 = pmVar7->refcount;
            if (piVar8 != (int *)0x0) {
              LOCK();
              *piVar8 = *piVar8 + -1;
              UNLOCK();
              if (*piVar8 == 0) {
                if (pmVar7->allocator == (Allocator *)0x0) {
                  if (pmVar7->data != (void *)0x0) {
                    free(pmVar7->data);
                  }
                }
                else {
                  (*pmVar7->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pmVar7->cstep = 0;
            pmVar7->data = (void *)0x0;
            pmVar7->refcount = (int *)0x0;
            *(undefined8 *)((long)&pmVar7->refcount + 4) = 0;
            *(undefined8 *)((long)&pmVar7->elemsize + 4) = 0;
            pmVar7->dims = 0;
            pmVar7->w = 0;
            pmVar7->h = 0;
            pmVar7->d = 0;
            pmVar7->c = 0;
            pmVar7->data = local_2e8.data;
            piVar8 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
            pmVar7->refcount = piVar8;
            pmVar7->elemsize = CONCAT44(local_2e8.elemsize._4_4_,(undefined4)local_2e8.elemsize);
            pmVar7->elempack = local_2e8.elempack;
            pmVar7->allocator = local_2e8.allocator;
            pmVar7->dims = local_2e8.dims;
            pmVar7->w = local_2e8.w;
            pmVar7->h = local_2e8.h;
            pmVar7->d = local_2e8.d;
            pmVar7->c = local_2e8.c;
            pmVar7->cstep = local_2e8.cstep;
          }
          pcVar4 = local_2f8;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (local_2e8.allocator == (Allocator *)0x0) {
                if (local_2e8.data != (void *)0x0) {
                  free(local_2e8.data);
                }
              }
              else {
                (*(local_2e8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2e8.cstep = 0;
          local_2e8.data = (void *)0x0;
          local_2e8.refcount._0_4_ = 0;
          local_2e8.refcount._4_4_ = 0;
          local_2e8.elemsize._0_4_ = 0;
          local_2e8.elemsize._4_4_ = 0;
          local_2e8.elempack = 0;
          local_2e8.dims = 0;
          local_2e8.w = 0;
          local_2e8.h = 0;
          local_2e8.d = 0;
          local_2e8.c = 0;
          if (local_290 != (int *)0x0) {
            LOCK();
            *local_290 = *local_290 + -1;
            UNLOCK();
            if (*local_290 == 0) {
              if (local_278 == (long *)0x0) {
LAB_00147057:
                local_2e8.cstep = 0;
                local_2e8.c = 0;
                local_2e8.h = 0;
                local_2e8.d = 0;
                local_2e8.dims = 0;
                local_2e8.w = 0;
                local_2e8.elempack = 0;
                local_2e8.elemsize._4_4_ = 0;
                local_2e8.elemsize._0_4_ = 0;
                local_2e8.refcount._4_4_ = 0;
                local_2e8.refcount._0_4_ = 0;
                local_2e8.data = (void *)0x0;
                if (local_298 != (float *)0x0) {
                  free(local_298);
                }
              }
              else {
                (**(code **)(*local_278 + 0x18))();
              }
            }
          }
        }
        pFVar3 = local_2f0;
        local_250._M_string_length = 0;
        *local_250._M_dataplus._M_p = '\0';
        if (iStack_310._M_current != local_318) {
          iStack_310._M_current = local_318;
        }
        iVar2 = feof(local_2f0);
      } while (iVar2 == 0);
    }
    fclose(pFVar3);
    operator_delete(pcVar4);
    if (local_318 != (float *)0x0) {
      operator_delete(local_318);
    }
    pcVar5 = local_220;
    binpath = local_228;
    pcVar4 = local_230;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
  }
  ncnn::Net::load_param((Net *)&local_210,local_218);
  iVar2 = strcmp(pcVar4,"null");
  if (iVar2 == 0) {
    ncnn::DataReader::DataReader(local_138);
    local_138[0]._vptr_DataReader = (_func_int **)&PTR__DataReader_00350cd0;
    ncnn::Net::load_model((Net *)&local_210,local_138);
    local_210.super_ModelWriter.gen_random_weight = 1;
    ncnn::DataReader::~DataReader(local_138);
  }
  else {
    ncnn::Net::load_model((Net *)&local_210,pcVar4);
  }
  NetQuantize::quantize_convolution(&local_210);
  NetQuantize::quantize_convolutiondepthwise(&local_210);
  NetQuantize::quantize_innerproduct(&local_210);
  NetQuantize::fuse_requantize(&local_210);
  iVar2 = 0;
  ModelWriter::save(&local_210.super_ModelWriter,pcVar5,binpath);
LAB_00146b17:
  local_210.super_ModelWriter.super_Net._vptr_Net = (_func_int **)&PTR__NetQuantize_00350bc0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  ::~_Rb_tree(&local_210.weight_int8scale_table._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  ::~_Rb_tree(&local_210.blob_int8scale_table._M_t);
  ncnn::Net::~Net((Net *)&local_210);
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 6)
    {
        fprintf(stderr, "usage: %s [inparam] [inbin] [outparam] [outbin] [calibration table]\n", argv[0]);
        return -1;
    }

    const char* inparam = argv[1];
    const char* inbin = argv[2];
    const char* outparam = argv[3];
    const char* outbin = argv[4];
    const char* int8scale_table_path = argv[5];

    NetQuantize quantizer;

    // parse the calibration scale table
    if (int8scale_table_path)
    {
        bool s2 = read_int8scale_table(int8scale_table_path, quantizer.blob_int8scale_table, quantizer.weight_int8scale_table);
        if (!s2)
        {
            fprintf(stderr, "read_int8scale_table failed\n");
            return -1;
        }
    }

    quantizer.load_param(inparam);
    if (strcmp(inbin, "null") == 0)
    {
        DataReaderFromEmpty dr;
        quantizer.load_model(dr);
        quantizer.gen_random_weight = true;
    }
    else
        quantizer.load_model(inbin);

    quantizer.quantize_convolution();
    quantizer.quantize_convolutiondepthwise();
    quantizer.quantize_innerproduct();

    quantizer.fuse_requantize();

    quantizer.save(outparam, outbin);

    return 0;
}